

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall
Memory::Recycler::TryMarkNonInterior(Recycler *this,void *candidate,void *parentReference)

{
  size_t *psVar1;
  Node *pNVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  MarkContext *markContext;
  
  if (this->isHeapEnumInProgress == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x847,"(!isHeapEnumInProgress)","!isHeapEnumInProgress");
    if (!bVar4) goto LAB_0071725a;
    *puVar5 = 0;
  }
  if ((this->collectionState).value == CollectionStateParallelMark) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x849,"(this->collectionState != CollectionStateParallelMark)",
                       "this->collectionState != CollectionStateParallelMark");
    if (!bVar4) goto LAB_0071725a;
    *puVar5 = 0;
  }
  if (((this->markContext).recycler)->isProcessingRescan == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/MarkContext.inl"
                       ,0xa3,"(!recycler->isProcessingRescan)","!recycler->isProcessingRescan");
    if (!bVar4) {
LAB_0071725a:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  markContext = &this->markContext;
  if (candidate < (void *)0x10000) {
    LOCK();
    psVar1 = &(markContext->recycler->collectionStats).tryMarkNullCount;
    *(int *)psVar1 = (int)*psVar1 + 1;
    UNLOCK();
  }
  else if (((ulong)candidate & 0xf) == 0) {
    for (pNVar2 = (markContext->recycler->heapBlockMap).list; pNVar2 != (Node *)0x0;
        pNVar2 = pNVar2->next) {
      if (pNVar2->nodeIndex == (uint)((ulong)candidate >> 0x20)) {
        HeapBlockMap32::Mark<false,false>(&pNVar2->map,candidate,markContext);
        return;
      }
    }
  }
  else {
    LOCK();
    psVar1 = &(markContext->recycler->collectionStats).tryMarkUnalignedCount;
    *(int *)psVar1 = (int)*psVar1 + 1;
    UNLOCK();
  }
  return;
}

Assistant:

void
Recycler::TryMarkNonInterior(void* candidate, void* parentReference)
{
#ifdef HEAP_ENUMERATION_VALIDATION
    Assert(!isHeapEnumInProgress || this->IsPostEnumHeapValidationInProgress());
#else
    Assert(!isHeapEnumInProgress);
#endif
    Assert(this->collectionState != CollectionStateParallelMark);
    markContext.Mark</*parallel */ false, /* interior */ false, /* doSpecialMark */ false>(candidate, parentReference);
}